

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O0

void __thiscall duckdb::WriteOverflowStringsToDisk::Flush(WriteOverflowStringsToDisk *this)

{
  ulong uVar1;
  long lVar2;
  idx_t iVar3;
  data_ptr_t pdVar4;
  BlockManager *pBVar5;
  FileBuffer *pFVar6;
  long in_RDI;
  BlockManager *block_manager;
  WriteOverflowStringsToDisk *in_stack_ffffffffffffffd0;
  
  if ((*(long *)(in_RDI + 0x28) != -1) && (*(long *)(in_RDI + 0x30) != 0)) {
    uVar1 = *(ulong *)(in_RDI + 0x30);
    iVar3 = GetStringSpace(in_stack_ffffffffffffffd0);
    if (uVar1 < iVar3) {
      pdVar4 = BufferHandle::Ptr((BufferHandle *)0x1972bec);
      lVar2 = *(long *)(in_RDI + 0x30);
      iVar3 = GetStringSpace(in_stack_ffffffffffffffd0);
      memset(pdVar4 + lVar2,0,iVar3 - *(long *)(in_RDI + 0x30));
    }
    pBVar5 = PartialBlockManager::GetBlockManager(*(PartialBlockManager **)(in_RDI + 8));
    pFVar6 = BufferHandle::GetFileBuffer((BufferHandle *)0x1972c42);
    (*pBVar5->_vptr_BlockManager[0xe])(pBVar5,pFVar6,*(undefined8 *)(in_RDI + 0x28));
  }
  *(undefined8 *)(in_RDI + 0x28) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  return;
}

Assistant:

void WriteOverflowStringsToDisk::Flush() {
	if (block_id != INVALID_BLOCK && offset > 0) {
		// zero-initialize the empty part of the overflow string buffer (if any)
		if (offset < GetStringSpace()) {
			memset(handle.Ptr() + offset, 0, GetStringSpace() - offset);
		}
		// write to disk
		auto &block_manager = partial_block_manager.GetBlockManager();
		block_manager.Write(handle.GetFileBuffer(), block_id);
	}
	block_id = INVALID_BLOCK;
	offset = 0;
}